

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sq2.c
# Opt level: O0

void crypto_sign_ed25519_ref10_fe_sq2(int32_t *h,int32_t *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int *in_RSI;
  int *in_RDI;
  int64_t h3;
  int64_t h2;
  int64_t h1;
  int64_t h0;
  int64_t f9f9_38;
  int64_t f8f9_38;
  int64_t f8f8_19;
  int64_t f7f9_76;
  int64_t f7f8_38;
  int64_t f7f7_38;
  int64_t f6f9_38;
  int64_t f6f8_38;
  int64_t f6f7_38;
  int64_t f6f6_19;
  int64_t f5f9_76;
  int64_t f5f8_38;
  int64_t f5f7_76;
  int64_t f5f6_38;
  int64_t f5f5_38;
  int64_t f4f9_38;
  int64_t f4f8_38;
  int64_t f4f7_38;
  int64_t f4f6_38;
  int64_t f4f5_2;
  int64_t f4f4;
  int64_t f3f9_76;
  int64_t f3f8_38;
  int64_t f3f7_76;
  int64_t f3f6_2;
  int64_t f3f5_4;
  int64_t f3f4_2;
  int64_t f3f3_2;
  int64_t f2f9_38;
  int64_t f2f8_38;
  int64_t f2f7_2;
  int64_t f2f6_2;
  int64_t f2f5_2;
  int64_t f2f4_2;
  int64_t f2f3_2;
  int64_t f2f2;
  int64_t f1f9_76;
  int64_t f1f8_2;
  int64_t f1f7_4;
  int64_t f1f6_2;
  int64_t f1f5_4;
  int64_t f1f4_2;
  int64_t f1f3_4;
  int64_t f1f2_2;
  int64_t f1f1_2;
  int64_t f0f9_2;
  int64_t f0f8_2;
  int64_t f0f7_2;
  int64_t f0f6_2;
  int64_t f0f5_2;
  int64_t f0f4_2;
  int64_t f0f3_2;
  int64_t f0f2_2;
  int64_t f0f1_2;
  int64_t f0f0;
  int32_t f9_38;
  int32_t f8_19;
  int32_t f7_38;
  int32_t f6_19;
  int32_t f5_38;
  int32_t f7_2;
  int32_t f6_2;
  int32_t f5_2;
  int32_t f4_2;
  int32_t f3_2;
  int32_t f2_2;
  int32_t f1_2;
  int32_t f0_2;
  int32_t f9;
  int32_t f8;
  int32_t f7;
  int32_t f6;
  int32_t f5;
  int32_t f4;
  int32_t f3;
  int32_t f2;
  int32_t f1;
  int32_t f0;
  int64_t carry9;
  int64_t carry8;
  int64_t carry7;
  int64_t carry6;
  int64_t carry5;
  int64_t carry4;
  int64_t carry3;
  int64_t carry2;
  int64_t carry1;
  int64_t carry0;
  int64_t h9;
  int64_t h8;
  int64_t h7;
  int64_t h6;
  int64_t h5;
  int64_t h4;
  
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  iVar3 = in_RSI[2];
  iVar4 = in_RSI[3];
  iVar5 = in_RSI[4];
  iVar6 = in_RSI[5];
  iVar7 = in_RSI[6];
  iVar8 = in_RSI[7];
  iVar9 = in_RSI[8];
  iVar10 = in_RSI[9];
  iVar11 = iVar1 << 1;
  iVar12 = iVar2 << 1;
  iVar13 = iVar3 << 1;
  iVar14 = iVar4 << 1;
  iVar15 = iVar5 << 1;
  iVar16 = iVar6 << 1;
  iVar17 = iVar8 << 1;
  iVar18 = iVar7 * 0x13;
  iVar19 = iVar8 * 0x26;
  iVar20 = iVar9 * 0x13;
  iVar21 = iVar10 * 0x26;
  lVar40 = ((long)iVar1 * (long)iVar1 + (long)iVar12 * (long)iVar21 + (long)iVar13 * (long)iVar20 +
            (long)iVar14 * (long)iVar19 + (long)iVar15 * (long)iVar18 +
           (long)iVar6 * (long)(iVar6 * 0x26)) * 2;
  lVar35 = ((long)iVar11 * (long)iVar5 + (long)iVar12 * (long)iVar14 + (long)iVar3 * (long)iVar3 +
            (long)iVar16 * (long)iVar21 + (long)(iVar7 << 1) * (long)iVar20 +
           (long)iVar8 * (long)iVar19) * 2;
  lVar22 = lVar40 + 0x2000000 >> 0x1a;
  lVar23 = lVar22 + ((long)iVar11 * (long)iVar2 + (long)iVar3 * (long)iVar21 +
                     (long)iVar14 * (long)iVar20 + (long)iVar5 * (long)iVar19 +
                    (long)iVar16 * (long)iVar18) * 2;
  lVar24 = lVar35 + 0x2000000 >> 0x1a;
  lVar25 = lVar24 + ((long)iVar11 * (long)iVar6 + (long)iVar12 * (long)iVar5 +
                     (long)iVar13 * (long)iVar4 + (long)iVar7 * (long)iVar21 +
                    (long)iVar17 * (long)iVar20) * 2;
  lVar26 = lVar23 + 0x1000000 >> 0x19;
  lVar27 = lVar26 + ((long)iVar11 * (long)iVar3 + (long)iVar12 * (long)iVar2 +
                     (long)iVar14 * (long)iVar21 + (long)iVar15 * (long)iVar20 +
                     (long)iVar16 * (long)iVar19 + (long)iVar7 * (long)iVar18) * 2;
  lVar28 = lVar25 + 0x1000000 >> 0x19;
  lVar29 = lVar28 + ((long)iVar11 * (long)iVar7 + (long)iVar12 * (long)iVar16 +
                     (long)iVar13 * (long)iVar5 + (long)iVar14 * (long)iVar4 +
                     (long)iVar17 * (long)iVar21 + (long)iVar9 * (long)iVar20) * 2;
  lVar30 = lVar27 + 0x2000000 >> 0x1a;
  lVar31 = lVar30 + ((long)iVar11 * (long)iVar4 + (long)iVar12 * (long)iVar3 +
                     (long)iVar5 * (long)iVar21 + (long)iVar16 * (long)iVar20 +
                    (long)iVar7 * (long)iVar19) * 2;
  lVar32 = lVar29 + 0x2000000 >> 0x1a;
  lVar33 = lVar32 + ((long)iVar11 * (long)iVar8 + (long)iVar12 * (long)iVar7 +
                     (long)iVar13 * (long)iVar6 + (long)iVar14 * (long)iVar5 +
                    (long)iVar9 * (long)iVar21) * 2;
  lVar34 = lVar31 + 0x1000000 >> 0x19;
  lVar35 = lVar34 + lVar35 + lVar24 * -0x4000000;
  lVar24 = lVar33 + 0x1000000 >> 0x19;
  lVar36 = lVar24 + ((long)iVar11 * (long)iVar9 + (long)iVar12 * (long)iVar17 +
                     (long)iVar13 * (long)iVar7 + (long)iVar14 * (long)iVar16 +
                     (long)iVar5 * (long)iVar5 + (long)iVar10 * (long)iVar21) * 2;
  iVar2 = (int)(lVar35 + 0x2000000 >> 0x1a);
  lVar37 = lVar36 + 0x2000000 >> 0x1a;
  lVar38 = lVar37 + ((long)iVar11 * (long)iVar10 + (long)iVar12 * (long)iVar9 +
                     (long)iVar13 * (long)iVar8 + (long)iVar14 * (long)iVar7 +
                    (long)iVar15 * (long)iVar6) * 2;
  lVar39 = lVar38 + 0x1000000 >> 0x19;
  lVar40 = lVar39 * 0x13 + lVar40 + lVar22 * -0x4000000;
  iVar1 = (int)(lVar40 + 0x2000000 >> 0x1a);
  *in_RDI = (int)lVar40 + iVar1 * -0x4000000;
  in_RDI[1] = iVar1 + (int)lVar23 + (int)lVar26 * -0x2000000;
  in_RDI[2] = (int)lVar27 + (int)lVar30 * -0x4000000;
  in_RDI[3] = (int)lVar31 + (int)lVar34 * -0x2000000;
  in_RDI[4] = (int)lVar35 + iVar2 * -0x4000000;
  in_RDI[5] = iVar2 + (int)lVar25 + (int)lVar28 * -0x2000000;
  in_RDI[6] = (int)lVar29 + (int)lVar32 * -0x4000000;
  in_RDI[7] = (int)lVar33 + (int)lVar24 * -0x2000000;
  in_RDI[8] = (int)lVar36 + (int)lVar37 * -0x4000000;
  in_RDI[9] = (int)lVar38 + (int)lVar39 * -0x2000000;
  return;
}

Assistant:

void fe_sq2(fe h,const fe f)
{
  crypto_int32 f0 = f[0];
  crypto_int32 f1 = f[1];
  crypto_int32 f2 = f[2];
  crypto_int32 f3 = f[3];
  crypto_int32 f4 = f[4];
  crypto_int32 f5 = f[5];
  crypto_int32 f6 = f[6];
  crypto_int32 f7 = f[7];
  crypto_int32 f8 = f[8];
  crypto_int32 f9 = f[9];
  crypto_int32 f0_2 = 2 * f0;
  crypto_int32 f1_2 = 2 * f1;
  crypto_int32 f2_2 = 2 * f2;
  crypto_int32 f3_2 = 2 * f3;
  crypto_int32 f4_2 = 2 * f4;
  crypto_int32 f5_2 = 2 * f5;
  crypto_int32 f6_2 = 2 * f6;
  crypto_int32 f7_2 = 2 * f7;
  crypto_int32 f5_38 = 38 * f5; /* 1.959375*2^30 */
  crypto_int32 f6_19 = 19 * f6; /* 1.959375*2^30 */
  crypto_int32 f7_38 = 38 * f7; /* 1.959375*2^30 */
  crypto_int32 f8_19 = 19 * f8; /* 1.959375*2^30 */
  crypto_int32 f9_38 = 38 * f9; /* 1.959375*2^30 */
  crypto_int64 f0f0    = f0   * (crypto_int64) f0;
  crypto_int64 f0f1_2  = f0_2 * (crypto_int64) f1;
  crypto_int64 f0f2_2  = f0_2 * (crypto_int64) f2;
  crypto_int64 f0f3_2  = f0_2 * (crypto_int64) f3;
  crypto_int64 f0f4_2  = f0_2 * (crypto_int64) f4;
  crypto_int64 f0f5_2  = f0_2 * (crypto_int64) f5;
  crypto_int64 f0f6_2  = f0_2 * (crypto_int64) f6;
  crypto_int64 f0f7_2  = f0_2 * (crypto_int64) f7;
  crypto_int64 f0f8_2  = f0_2 * (crypto_int64) f8;
  crypto_int64 f0f9_2  = f0_2 * (crypto_int64) f9;
  crypto_int64 f1f1_2  = f1_2 * (crypto_int64) f1;
  crypto_int64 f1f2_2  = f1_2 * (crypto_int64) f2;
  crypto_int64 f1f3_4  = f1_2 * (crypto_int64) f3_2;
  crypto_int64 f1f4_2  = f1_2 * (crypto_int64) f4;
  crypto_int64 f1f5_4  = f1_2 * (crypto_int64) f5_2;
  crypto_int64 f1f6_2  = f1_2 * (crypto_int64) f6;
  crypto_int64 f1f7_4  = f1_2 * (crypto_int64) f7_2;
  crypto_int64 f1f8_2  = f1_2 * (crypto_int64) f8;
  crypto_int64 f1f9_76 = f1_2 * (crypto_int64) f9_38;
  crypto_int64 f2f2    = f2   * (crypto_int64) f2;
  crypto_int64 f2f3_2  = f2_2 * (crypto_int64) f3;
  crypto_int64 f2f4_2  = f2_2 * (crypto_int64) f4;
  crypto_int64 f2f5_2  = f2_2 * (crypto_int64) f5;
  crypto_int64 f2f6_2  = f2_2 * (crypto_int64) f6;
  crypto_int64 f2f7_2  = f2_2 * (crypto_int64) f7;
  crypto_int64 f2f8_38 = f2_2 * (crypto_int64) f8_19;
  crypto_int64 f2f9_38 = f2   * (crypto_int64) f9_38;
  crypto_int64 f3f3_2  = f3_2 * (crypto_int64) f3;
  crypto_int64 f3f4_2  = f3_2 * (crypto_int64) f4;
  crypto_int64 f3f5_4  = f3_2 * (crypto_int64) f5_2;
  crypto_int64 f3f6_2  = f3_2 * (crypto_int64) f6;
  crypto_int64 f3f7_76 = f3_2 * (crypto_int64) f7_38;
  crypto_int64 f3f8_38 = f3_2 * (crypto_int64) f8_19;
  crypto_int64 f3f9_76 = f3_2 * (crypto_int64) f9_38;
  crypto_int64 f4f4    = f4   * (crypto_int64) f4;
  crypto_int64 f4f5_2  = f4_2 * (crypto_int64) f5;
  crypto_int64 f4f6_38 = f4_2 * (crypto_int64) f6_19;
  crypto_int64 f4f7_38 = f4   * (crypto_int64) f7_38;
  crypto_int64 f4f8_38 = f4_2 * (crypto_int64) f8_19;
  crypto_int64 f4f9_38 = f4   * (crypto_int64) f9_38;
  crypto_int64 f5f5_38 = f5   * (crypto_int64) f5_38;
  crypto_int64 f5f6_38 = f5_2 * (crypto_int64) f6_19;
  crypto_int64 f5f7_76 = f5_2 * (crypto_int64) f7_38;
  crypto_int64 f5f8_38 = f5_2 * (crypto_int64) f8_19;
  crypto_int64 f5f9_76 = f5_2 * (crypto_int64) f9_38;
  crypto_int64 f6f6_19 = f6   * (crypto_int64) f6_19;
  crypto_int64 f6f7_38 = f6   * (crypto_int64) f7_38;
  crypto_int64 f6f8_38 = f6_2 * (crypto_int64) f8_19;
  crypto_int64 f6f9_38 = f6   * (crypto_int64) f9_38;
  crypto_int64 f7f7_38 = f7   * (crypto_int64) f7_38;
  crypto_int64 f7f8_38 = f7_2 * (crypto_int64) f8_19;
  crypto_int64 f7f9_76 = f7_2 * (crypto_int64) f9_38;
  crypto_int64 f8f8_19 = f8   * (crypto_int64) f8_19;
  crypto_int64 f8f9_38 = f8   * (crypto_int64) f9_38;
  crypto_int64 f9f9_38 = f9   * (crypto_int64) f9_38;
  crypto_int64 h0 = f0f0  +f1f9_76+f2f8_38+f3f7_76+f4f6_38+f5f5_38;
  crypto_int64 h1 = f0f1_2+f2f9_38+f3f8_38+f4f7_38+f5f6_38;
  crypto_int64 h2 = f0f2_2+f1f1_2 +f3f9_76+f4f8_38+f5f7_76+f6f6_19;
  crypto_int64 h3 = f0f3_2+f1f2_2 +f4f9_38+f5f8_38+f6f7_38;
  crypto_int64 h4 = f0f4_2+f1f3_4 +f2f2   +f5f9_76+f6f8_38+f7f7_38;
  crypto_int64 h5 = f0f5_2+f1f4_2 +f2f3_2 +f6f9_38+f7f8_38;
  crypto_int64 h6 = f0f6_2+f1f5_4 +f2f4_2 +f3f3_2 +f7f9_76+f8f8_19;
  crypto_int64 h7 = f0f7_2+f1f6_2 +f2f5_2 +f3f4_2 +f8f9_38;
  crypto_int64 h8 = f0f8_2+f1f7_4 +f2f6_2 +f3f5_4 +f4f4   +f9f9_38;
  crypto_int64 h9 = f0f9_2+f1f8_2 +f2f7_2 +f3f6_2 +f4f5_2;
  crypto_int64 carry0;
  crypto_int64 carry1;
  crypto_int64 carry2;
  crypto_int64 carry3;
  crypto_int64 carry4;
  crypto_int64 carry5;
  crypto_int64 carry6;
  crypto_int64 carry7;
  crypto_int64 carry8;
  crypto_int64 carry9;

  h0 += h0;
  h1 += h1;
  h2 += h2;
  h3 += h3;
  h4 += h4;
  h5 += h5;
  h6 += h6;
  h7 += h7;
  h8 += h8;
  h9 += h9;

  carry0 = (h0 + (crypto_int64) (1<<25)) >> 26; h1 += carry0; h0 -= carry0 << 26;
  carry4 = (h4 + (crypto_int64) (1<<25)) >> 26; h5 += carry4; h4 -= carry4 << 26;

  carry1 = (h1 + (crypto_int64) (1<<24)) >> 25; h2 += carry1; h1 -= carry1 << 25;
  carry5 = (h5 + (crypto_int64) (1<<24)) >> 25; h6 += carry5; h5 -= carry5 << 25;

  carry2 = (h2 + (crypto_int64) (1<<25)) >> 26; h3 += carry2; h2 -= carry2 << 26;
  carry6 = (h6 + (crypto_int64) (1<<25)) >> 26; h7 += carry6; h6 -= carry6 << 26;

  carry3 = (h3 + (crypto_int64) (1<<24)) >> 25; h4 += carry3; h3 -= carry3 << 25;
  carry7 = (h7 + (crypto_int64) (1<<24)) >> 25; h8 += carry7; h7 -= carry7 << 25;

  carry4 = (h4 + (crypto_int64) (1<<25)) >> 26; h5 += carry4; h4 -= carry4 << 26;
  carry8 = (h8 + (crypto_int64) (1<<25)) >> 26; h9 += carry8; h8 -= carry8 << 26;

  carry9 = (h9 + (crypto_int64) (1<<24)) >> 25; h0 += carry9 * 19; h9 -= carry9 << 25;

  carry0 = (h0 + (crypto_int64) (1<<25)) >> 26; h1 += carry0; h0 -= carry0 << 26;

  h[0] = h0;
  h[1] = h1;
  h[2] = h2;
  h[3] = h3;
  h[4] = h4;
  h[5] = h5;
  h[6] = h6;
  h[7] = h7;
  h[8] = h8;
  h[9] = h9;
}